

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schematron.c
# Opt level: O2

xmlNodePtr xmlSchematronNextNode(xmlNodePtr cur)

{
  xmlNodePtr pxVar1;
  
  pxVar1 = cur->children;
  if (((pxVar1 == (xmlNodePtr)0x0) || (pxVar1->type == XML_ENTITY_DECL)) ||
     (cur = pxVar1, pxVar1->type == XML_DTD_NODE)) {
    do {
      pxVar1 = cur->next;
      if (pxVar1 == (_xmlNode *)0x0) {
        while ((cur = cur->parent, cur != (_xmlNode *)0x0 && (cur->type != XML_DOCUMENT_NODE))) {
          if (cur->next != (_xmlNode *)0x0) {
            return cur->next;
          }
        }
        return (xmlNodePtr)0x0;
      }
      cur = pxVar1;
    } while ((pxVar1->type == XML_DTD_NODE) || (pxVar1->type == XML_ENTITY_DECL));
  }
  return pxVar1;
}

Assistant:

static xmlNodePtr
xmlSchematronNextNode(xmlNodePtr cur) {
    if (cur->children != NULL) {
        /*
         * Do not descend on entities declarations
         */
        if (cur->children->type != XML_ENTITY_DECL) {
            cur = cur->children;
            /*
             * Skip DTDs
             */
            if (cur->type != XML_DTD_NODE)
                return(cur);
        }
    }

    while (cur->next != NULL) {
        cur = cur->next;
        if ((cur->type != XML_ENTITY_DECL) &&
            (cur->type != XML_DTD_NODE))
            return(cur);
    }

    do {
        cur = cur->parent;
        if (cur == NULL) break;
        if (cur->type == XML_DOCUMENT_NODE) return(NULL);
        if (cur->next != NULL) {
            cur = cur->next;
            return(cur);
        }
    } while (cur != NULL);
    return(cur);
}